

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptnum_tests.cpp
# Opt level: O0

void scriptnum_tests::RunCreate(int64_t *num)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  long in_FS_OFFSET;
  scriptnum10_error *ex;
  CScriptNum scriptnum;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[52],_const_char_(&)[52]>
  *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  assertion_result *in_stack_fffffffffffffe78;
  const_string *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  lazy_ostream *in_stack_fffffffffffffea0;
  unit_test_log_t *in_stack_fffffffffffffea8;
  int64_t *in_stack_ffffffffffffff00;
  int64_t *in_stack_ffffffffffffff48;
  const_string local_b0;
  lazy_ostream local_a0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CheckCreateInt(in_stack_ffffffffffffff48);
  CScriptNum::CScriptNum((CScriptNum *)in_stack_fffffffffffffe68,(int64_t *)0xa98a09);
  CScriptNum::getvch((CScriptNum *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffe68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe78);
  if (sVar3 < 5) {
    CheckCreateVch(in_stack_ffffffffffffff00);
  }
  else {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
                 (pointer)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 (unsigned_long)in_stack_fffffffffffffe68);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe68);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffffea8,(const_string *)in_stack_fffffffffffffea0,
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffe90);
      CheckCreateVch(in_stack_ffffffffffffff00);
      do {
        in_stack_fffffffffffffea8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
                   (pointer)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                   (unsigned_long)in_stack_fffffffffffffe68);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffe68);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffffea8,(const_string *)in_stack_fffffffffffffea0,
                   CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                   in_stack_fffffffffffffe90);
        boost::test_tools::assertion_result::assertion_result
                  (in_stack_fffffffffffffe78,(bool)in_stack_fffffffffffffe77);
        in_stack_fffffffffffffea0 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                   (char (*) [52])in_stack_fffffffffffffe68);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
                   (pointer)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                   (unsigned_long)in_stack_fffffffffffffe68);
        in_stack_fffffffffffffe68 =
             (lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[52],_const_char_(&)[52]> *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&stack0xffffffffffffff80,&local_a0,&local_b0,0x99,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[52],_const_char_(&)[52]>::
        ~lazy_ostream_impl(in_stack_fffffffffffffe68);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffe68);
        in_stack_fffffffffffffe9f = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffffe9f);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void RunCreate(const int64_t& num)
{
    CheckCreateInt(num);
    CScriptNum scriptnum(num);
    if (scriptnum.getvch().size() <= CScriptNum::nDefaultMaxNumSize)
        CheckCreateVch(num);
    else
    {
        BOOST_CHECK_THROW (CheckCreateVch(num), scriptnum10_error);
    }
}